

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O3

void write_invalid_module(Context *ctx,Var obj,ScriptModule *module,string *text)

{
  CreateBufferFn p_Var1;
  _func_int **pp_Var2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  Var pvVar5;
  char *messageIfFailed;
  
  iVar3 = (*module->_vptr_ScriptModule[2])(module);
  pvVar5 = (*ctx->chakra->spec->int32ToVar)
                     (*(int32 *)(CONCAT44(extraout_var,iVar3) + 0x10),ctx->chakra->user_data);
  set_property(ctx,obj,7,pvVar5,"Unable to write number");
  write_string(ctx,obj,10,(text->_M_dataplus)._M_p,text->_M_string_length);
  if (module->type_ - Binary < 2) {
    p_Var1 = ctx->chakra->createBuffer;
    pp_Var2 = module[5]._vptr_ScriptModule;
    uVar4 = TruncSizeT(*(long *)&module[5].type_ - (long)pp_Var2);
    pvVar5 = (*p_Var1)((uchar *)pp_Var2,uVar4,ctx->chakra->user_data);
    messageIfFailed = "Unable to set invalid module";
  }
  else {
    if (module->type_ != Text) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/chakra/wabtapi.cc"
                    ,0x14e,
                    "void write_invalid_module(Context *, Js::Var, const ScriptModule *, const std::string &)"
                   );
    }
    pvVar5 = create_module(ctx,(Module *)(module + 1),false);
    messageIfFailed = "Unable to set module";
  }
  set_property(ctx,obj,3,pvVar5,messageIfFailed);
  return;
}

Assistant:

static void write_invalid_module(Context* ctx, Js::Var obj, const ScriptModule* module, const std::string& text)
{
    write_location(ctx, obj, &module->location());
    write_string(ctx, obj, PropertyIds::text, text);
    const std::vector<uint8_t>* data = nullptr;
    switch (module->type())
    {
    case ScriptModuleType::Text:
        write_module(ctx, obj, &cast<TextScriptModule>(module)->module, false);
        break;
    case ScriptModuleType::Binary:
        data = &cast<BinaryScriptModule>(module)->data;
        goto create_binary_module;
    case ScriptModuleType::Quoted:
        data = &cast<QuotedScriptModule>(module)->data;
    create_binary_module:
        {
            Js::Var buffer = ctx->chakra->createBuffer(data->data(), TruncSizeT(data->size()), ctx->chakra->user_data);
            set_property(ctx, obj, PropertyIds::buffer, buffer, "Unable to set invalid module");
            break;
        }
    default:
        assert(false);
        break;
    }
}